

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::build_workgroup_size
          (CompilerGLSL *this,
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          *arguments,SpecializationConstant *wg_x,SpecializationConstant *wg_y,
          SpecializationConstant *wg_z)

{
  SPIREntryPoint *pSVar1;
  ulong uVar2;
  SPIRConstant *pSVar3;
  undefined7 uVar4;
  byte bVar5;
  undefined1 uVar6;
  string local_60;
  uint32_t local_3c;
  SpecializationConstant *local_38;
  
  uVar4 = (undefined7)((ulong)wg_y >> 8);
  local_38 = wg_z;
  pSVar1 = Compiler::get_entry_point(&this->super_Compiler);
  uVar6 = (pSVar1->workgroup_size).constant == 0;
  bVar5 = (byte)(uint)((pSVar1->flags).lower >> 0x26) & 1 & uVar6;
  uVar2 = (ulong)(wg_x->id).id;
  if (uVar2 == 0) {
    if ((bVar5 == 0) || (uVar2 = (ulong)(pSVar1->workgroup_size).id_x, uVar2 == 0)) {
      join<char_const(&)[16],unsigned_int&>
                (&local_60,(spirv_cross *)"local_size_x = ",(char (*) [16])&pSVar1->workgroup_size,
                 (uint *)CONCAT71(uVar4,uVar6));
    }
    else {
      pSVar3 = Variant::get<spirv_cross::SPIRConstant>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          uVar2);
      local_3c = (pSVar3->m).c[0].r[0].u32;
      join<char_const(&)[16],unsigned_int>
                (&local_60,(spirv_cross *)"local_size_x = ",(char (*) [16])&local_3c,
                 (uint *)CONCAT71(uVar4,uVar6));
    }
  }
  else if ((this->options).vulkan_semantics == true) {
    join<char_const(&)[19],unsigned_int_const&>
              (&local_60,(spirv_cross *)"local_size_x_id = ",(char (*) [19])&wg_x->constant_id,
               (uint *)CONCAT71(uVar4,uVar6));
  }
  else {
    pSVar3 = Variant::get<spirv_cross::SPIRConstant>
                       ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                        uVar2);
    join<char_const(&)[16],std::__cxx11::string&>
              (&local_60,(spirv_cross *)"local_size_x = ",
               (char (*) [16])&pSVar3->specialization_constant_macro_name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT71(uVar4,uVar6));
  }
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::push_back(arguments,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  uVar2 = (ulong)(wg_y->id).id;
  if (uVar2 == 0) {
    if ((bVar5 == 0) || (uVar2 = (ulong)(pSVar1->workgroup_size).id_y, uVar2 == 0)) {
      join<char_const(&)[16],unsigned_int&>
                (&local_60,(spirv_cross *)"local_size_y = ",
                 (char (*) [16])&(pSVar1->workgroup_size).y,(uint *)CONCAT71(uVar4,uVar6));
    }
    else {
      pSVar3 = Variant::get<spirv_cross::SPIRConstant>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          uVar2);
      local_3c = (pSVar3->m).c[0].r[0].u32;
      join<char_const(&)[16],unsigned_int>
                (&local_60,(spirv_cross *)"local_size_y = ",(char (*) [16])&local_3c,
                 (uint *)CONCAT71(uVar4,uVar6));
    }
  }
  else if ((this->options).vulkan_semantics == true) {
    join<char_const(&)[19],unsigned_int_const&>
              (&local_60,(spirv_cross *)"local_size_y_id = ",(char (*) [19])&wg_y->constant_id,
               (uint *)CONCAT71(uVar4,uVar6));
  }
  else {
    pSVar3 = Variant::get<spirv_cross::SPIRConstant>
                       ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                        uVar2);
    join<char_const(&)[16],std::__cxx11::string&>
              (&local_60,(spirv_cross *)"local_size_y = ",
               (char (*) [16])&pSVar3->specialization_constant_macro_name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT71(uVar4,uVar6));
  }
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::push_back(arguments,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  uVar2 = (ulong)(local_38->id).id;
  if (uVar2 == 0) {
    if ((bVar5 == 0) || (uVar2 = (ulong)(pSVar1->workgroup_size).id_z, uVar2 == 0)) {
      join<char_const(&)[16],unsigned_int&>
                (&local_60,(spirv_cross *)"local_size_z = ",
                 (char (*) [16])&(pSVar1->workgroup_size).z,(uint *)CONCAT71(uVar4,uVar6));
    }
    else {
      pSVar3 = Variant::get<spirv_cross::SPIRConstant>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          uVar2);
      local_3c = (pSVar3->m).c[0].r[0].u32;
      join<char_const(&)[16],unsigned_int>
                (&local_60,(spirv_cross *)"local_size_z = ",(char (*) [16])&local_3c,
                 (uint *)CONCAT71(uVar4,uVar6));
    }
  }
  else if ((this->options).vulkan_semantics == true) {
    join<char_const(&)[19],unsigned_int_const&>
              (&local_60,(spirv_cross *)"local_size_z_id = ",(char (*) [19])&local_38->constant_id,
               (uint *)CONCAT71(uVar4,uVar6));
  }
  else {
    pSVar3 = Variant::get<spirv_cross::SPIRConstant>
                       ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                        uVar2);
    join<char_const(&)[16],std::__cxx11::string&>
              (&local_60,(spirv_cross *)"local_size_z = ",
               (char (*) [16])&pSVar3->specialization_constant_macro_name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT71(uVar4,uVar6));
  }
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::push_back(arguments,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerGLSL::build_workgroup_size(SmallVector<string> &arguments, const SpecializationConstant &wg_x,
                                        const SpecializationConstant &wg_y, const SpecializationConstant &wg_z)
{
	auto &execution = get_entry_point();
	bool builtin_workgroup = execution.workgroup_size.constant != 0;
	bool use_local_size_id = !builtin_workgroup && execution.flags.get(ExecutionModeLocalSizeId);

	if (wg_x.id)
	{
		if (options.vulkan_semantics)
			arguments.push_back(join("local_size_x_id = ", wg_x.constant_id));
		else
			arguments.push_back(join("local_size_x = ", get<SPIRConstant>(wg_x.id).specialization_constant_macro_name));
	}
	else if (use_local_size_id && execution.workgroup_size.id_x)
		arguments.push_back(join("local_size_x = ", get<SPIRConstant>(execution.workgroup_size.id_x).scalar()));
	else
		arguments.push_back(join("local_size_x = ", execution.workgroup_size.x));

	if (wg_y.id)
	{
		if (options.vulkan_semantics)
			arguments.push_back(join("local_size_y_id = ", wg_y.constant_id));
		else
			arguments.push_back(join("local_size_y = ", get<SPIRConstant>(wg_y.id).specialization_constant_macro_name));
	}
	else if (use_local_size_id && execution.workgroup_size.id_y)
		arguments.push_back(join("local_size_y = ", get<SPIRConstant>(execution.workgroup_size.id_y).scalar()));
	else
		arguments.push_back(join("local_size_y = ", execution.workgroup_size.y));

	if (wg_z.id)
	{
		if (options.vulkan_semantics)
			arguments.push_back(join("local_size_z_id = ", wg_z.constant_id));
		else
			arguments.push_back(join("local_size_z = ", get<SPIRConstant>(wg_z.id).specialization_constant_macro_name));
	}
	else if (use_local_size_id && execution.workgroup_size.id_z)
		arguments.push_back(join("local_size_z = ", get<SPIRConstant>(execution.workgroup_size.id_z).scalar()));
	else
		arguments.push_back(join("local_size_z = ", execution.workgroup_size.z));
}